

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O2

void __thiscall
soul::heart::Parser::scanStateVariable(Parser *this,ScannedTopLevelItem *item,bool isConstant)

{
  UTF8Reader local_10;
  
  local_10.data =
       (this->
       super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
       ).location.location.data;
  std::vector<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>::emplace_back<soul::UTF8Reader>
            (&item->stateVariableDecls,&local_10);
  skipPastNextOccurrenceOf(this,(TokenType)0x2a19e8);
  return;
}

Assistant:

void scanStateVariable (ScannedTopLevelItem& item, bool isConstant)
    {
        ignoreUnused (isConstant);

        item.stateVariableDecls.push_back (getCurrentTokeniserPosition());
        skipPastNextOccurrenceOf (HEARTOperator::semicolon);
    }